

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

string * __thiscall
cmFindProgramCommand::FindNormalProgramDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  bool bVar1;
  string *path;
  pointer name;
  cmFindProgramHelper helper;
  string local_c0;
  undefined1 local_a0 [112];
  
  cmFindProgramHelper::cmFindProgramHelper((cmFindProgramHelper *)local_a0);
  name = (this->super_cmFindBase).Names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (name == (this->super_cmFindBase).Names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_c0);
LAB_003af687:
      cmFindProgramHelper::~cmFindProgramHelper((cmFindProgramHelper *)local_a0);
      return __return_storage_ptr__;
    }
    cmFindProgramHelper::SetName((cmFindProgramHelper *)local_a0,name);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    bVar1 = cmFindProgramHelper::CheckDirectory((cmFindProgramHelper *)local_a0,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_a0 + 0x18));
      goto LAB_003af687;
    }
    path = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    while (path != (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = cmFindProgramHelper::CheckDirectory((cmFindProgramHelper *)local_a0,path);
      path = path + 1;
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_a0 + 0x18));
        goto LAB_003af687;
      }
    }
    name = name + 1;
  } while( true );
}

Assistant:

std::string cmFindProgramCommand::FindNormalProgramDirsPerName()
{
  // Search the entire path for each name.
  cmFindProgramHelper helper;
  for (std::vector<std::string>::const_iterator ni = this->Names.begin();
       ni != this->Names.end() ; ++ni)
    {
    // Switch to searching for this name.
    helper.SetName(*ni);

    // Check for the name by itself (e.g. an absolute path).
    if (helper.CheckDirectory(std::string()))
      {
      return helper.BestPath;
      }

    // Search every directory.
    for (std::vector<std::string>::const_iterator
           p = this->SearchPaths.begin();
         p != this->SearchPaths.end(); ++p)
      {
      if (helper.CheckDirectory(*p))
        {
        return helper.BestPath;
        }
      }
    }
  // Couldn't find the program.
  return "";
}